

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall TPZPrInteg<TPZInt1Point>::GetOrder(TPZPrInteg<TPZInt1Point> *this,TPZVec<int> *ord)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  TPZVec<int> *in_RSI;
  TPZInt1Point *in_RDI;
  
  iVar2 = TPZVec<int>::NElements(in_RSI);
  if (iVar2 < 1) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
                   );
  }
  else {
    TPZInt1Point::GetOrder(in_RDI,in_RSI);
    iVar1 = *(int *)&in_RDI[1].super_TPZIntPoints._vptr_TPZIntPoints;
    piVar3 = TPZVec<int>::operator[](in_RSI,0);
    *piVar3 = iVar1;
  }
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }